

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_krp.c
# Opt level: O0

void beltKRPStart(void *state,octet *key,size_t len,octet *level)

{
  u32 *in_RCX;
  undefined8 in_RDX;
  octet *in_RDI;
  belt_krp_st *st;
  
  u32From(in_RCX,in_RDI,0x14b68c);
  *(undefined8 *)(in_RDI + 0x20) = in_RDX;
  beltKeyExpand2(in_RCX,in_RDI,0x14b6a7);
  return;
}

Assistant:

void beltKRPStart(void* state, const octet key[], size_t len, 
	const octet level[12])
{
	belt_krp_st* st = (belt_krp_st*)state;
	ASSERT(memIsDisjoint2(level, 12, state, beltKRP_keep()));
	// block <- ... || level || ...
	u32From(st->block + 1, level, 12);
	// сохранить ключ
	beltKeyExpand2(st->key, key, st->len = len);
}